

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fiordrscext(errcxdef *ec,osfildef *fp,appctxdef *appctx,int resfileno,char *resfilename)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  unsigned_long uVar5;
  FILE *in_RSI;
  long *in_RDI;
  errcxdef *in_R8;
  unsigned_long startofs;
  unsigned_long endpos;
  uchar buf [89];
  char *in_stack_ffffffffffffff28;
  long *plVar6;
  errcxdef *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  errcxdef *in_stack_ffffffffffffff40;
  byte local_88;
  undefined1 auStack_87 [12];
  undefined1 auStack_7b [83];
  errcxdef *local_28;
  FILE *local_10;
  long *local_8;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar2 = ftell(in_RSI);
  sVar3 = fread(&local_88,0x16,1,local_10);
  if (sVar3 != 1) {
    strlen((char *)local_28);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    pcVar4 = errstr(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                    (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    *(char **)(*local_8 + 0x18) = pcVar4;
    *(undefined4 *)(*local_8 + 0x68) = 1;
    errsign(in_stack_ffffffffffffff30,iVar1,(char *)0x274677);
  }
  iVar1 = memcmp(&local_88,"TADS2 rsc\n\r\x1a",0xd);
  if (iVar1 != 0) {
    strlen((char *)local_28);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    pcVar4 = errstr(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                    (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    *(char **)(*local_8 + 0x18) = pcVar4;
    *(undefined4 *)(*local_8 + 0x68) = 1;
    errsign(in_stack_ffffffffffffff30,iVar1,(char *)0x274707);
  }
  iVar1 = memcmp(auStack_7b,"v2.2.0",7);
  if (((iVar1 != 0) && (iVar1 = memcmp(auStack_7b,"v2.0.0",7), iVar1 != 0)) &&
     (iVar1 = memcmp(auStack_7b,"v2.0.1",7), iVar1 != 0)) {
    errsigf(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
  }
  sVar3 = fread(&local_88,0x1a,1,local_10);
  if (sVar3 != 1) {
    plVar6 = local_8;
    strlen((char *)local_28);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    pcVar4 = errstr(local_28,(char *)plVar6,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    *(char **)(*local_8 + 0x18) = pcVar4;
    *(undefined4 *)(*local_8 + 0x68) = 1;
    errsign(in_stack_ffffffffffffff30,iVar1,(char *)0x274814);
  }
  while( true ) {
    sVar3 = fread(&local_88,1,1,local_10);
    if ((sVar3 != 1) || (sVar3 = fread(auStack_87,(long)(int)(local_88 + 4),1,local_10), sVar3 != 1)
       ) {
      plVar6 = local_8;
      strlen((char *)local_28);
      iVar1 = (int)((ulong)plVar6 >> 0x20);
      pcVar4 = errstr(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                      (int)((ulong)local_28 >> 0x20));
      *(char **)(*local_8 + 0x18) = pcVar4;
      *(undefined4 *)(*local_8 + 0x68) = 1;
      errsign(local_28,iVar1,(char *)0x2748d5);
    }
    uVar5 = osrp4(auStack_87 + (int)(uint)local_88);
    if ((local_88 != 7) || (iVar1 = memcmp(auStack_87,"HTMLRES",7), iVar1 != 0)) break;
    fiordhtml((errcxdef *)buf._80_8_,(osfildef *)buf._72_8_,(appctxdef *)buf._64_8_,buf._60_4_,
              (char *)buf._48_8_);
    fseek(local_10,uVar5 + lVar2,0);
  }
  if ((local_88 == 4) && (iVar1 = memcmp(auStack_87,"$EOF",4), iVar1 == 0)) {
    return;
  }
  errsigf(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
}

Assistant:

static void fiordrscext(errcxdef *ec, osfildef *fp, appctxdef *appctx,
                        int resfileno, char *resfilename)
{
    uchar buf[TOKNAMMAX + 50];
    unsigned long endpos;
    unsigned long startofs;

    /* note the starting offset */
    startofs = osfpos(fp);
    
    /* check file and version headers, and get flags and timestamp */
    if (osfrb(fp, buf, (int)(sizeof(FIOFILHDR) + sizeof(FIOVSNHDR) + 2)))
        errsig1(ec, ERR_RDRSC, ERRTSTR,
                errstr(ec, resfilename, strlen(resfilename)));
    if (memcmp(buf, FIOFILHDRRSC, (size_t)sizeof(FIOFILHDRRSC)))
        errsig1(ec, ERR_BADHDRRSC, ERRTSTR,
                errstr(ec, resfilename, strlen(resfilename)));
    if (memcmp(buf + sizeof(FIOFILHDR), FIOVSNHDR,
               (size_t)sizeof(FIOVSNHDR))
        && memcmp(buf + sizeof(FIOFILHDR), FIOVSNHDR2,
                  (size_t)sizeof(FIOVSNHDR2))
        && memcmp(buf + sizeof(FIOFILHDR), FIOVSNHDR3,
                  (size_t)sizeof(FIOVSNHDR3)))
        errsig(ec, ERR_BADVSN);
    if (osfrb(fp, buf, (size_t)26))
        errsig1(ec, ERR_RDRSC, ERRTSTR,
                errstr(ec, resfilename, strlen(resfilename)));

    /* now read resources from the file */
    for (;;)
    {
        /* read resource type and next-resource pointer */
        if (osfrb(fp, buf, 1)
            || osfrb(fp, buf + 1, (int)(buf[0] + 4)))
            errsig1(ec, ERR_RDRSC, ERRTSTR,
                    errstr(ec, resfilename, strlen(resfilename)));
        endpos = osrp4(buf + 1 + buf[0]);

        /* check the resource type */
        if (fioisrsc(buf, "HTMLRES"))
        {
            /* read the HTML resource map */
            fiordhtml(ec, fp, appctx, resfileno, resfilename);

            /* 
             *   skip the resources - they're entirely for the host
             *   application's use 
             */
            osfseek(fp, endpos + startofs, OSFSK_SET);
        }
        else if (fioisrsc(buf, "$EOF"))
        {
            /* we're done reading the file */
            break;
        }
        else
            errsig(ec, ERR_UNKRSC);
    }
}